

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O2

void __thiscall
ADE_DEP_DPFSP::stampa(ADE_DEP_DPFSP *this,Permutazione **popolazione,unsigned_short nIndividui)

{
  ostream *poVar1;
  undefined2 in_register_00000012;
  ulong uVar2;
  int j;
  long lVar3;
  
  for (uVar2 = 0; uVar2 != CONCAT22(in_register_00000012,nIndividui); uVar2 = uVar2 + 1) {
    for (lVar3 = 0;
        lVar3 < (long)((ulong)(this->istanza).lavori + (ulong)(this->istanza).fabbriche + -1);
        lVar3 = lVar3 + 1) {
      poVar1 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,popolazione[uVar2]->individuo[lVar3]);
      std::operator<<(poVar1," ");
    }
    poVar1 = std::operator<<((ostream *)&std::cout,":");
    poVar1 = std::operator<<(poVar1,"\t");
    (*(this->super_ADE<Permutazione>)._vptr_ADE[7])(this,popolazione[uVar2]);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void ADE_DEP_DPFSP::stampa(Permutazione** popolazione, unsigned short nIndividui) {

	for (int i = 0; i < nIndividui; i++) {

		for (int j = 0; j < istanza.lavori + istanza.fabbriche - 1; j++) {
			cout << popolazione[i]->individuo[j] << " ";
		}

		cout << ":" << "\t" << valutaIndividuo(popolazione[i]) << endl;
	}

	cout << endl;
}